

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O3

SchemaResolution __thiscall avro::NodeUnion::resolve(NodeUnion *this,Node *reader)

{
  int iVar1;
  SchemaResolution SVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar3;
  SchemaResolution SVar4;
  
  iVar1 = (*(this->super_NodeImplUnion).super_Node._vptr_Node[4])();
  SVar4 = RESOLVE_NO_MATCH;
  if (CONCAT44(extraout_var,iVar1) != 0) {
    uVar3 = 0;
    do {
      iVar1 = (*(this->super_NodeImplUnion).super_Node._vptr_Node[5])(this,uVar3 & 0xffffffff);
      SVar2 = (**(code **)(**(long **)CONCAT44(extraout_var_00,iVar1) + 0x60))
                        (*(long **)CONCAT44(extraout_var_00,iVar1),reader);
      if (SVar2 == RESOLVE_MATCH) {
        return RESOLVE_MATCH;
      }
      if (SVar4 == RESOLVE_NO_MATCH) {
        SVar4 = SVar2;
      }
      uVar3 = uVar3 + 1;
      iVar1 = (*(this->super_NodeImplUnion).super_Node._vptr_Node[4])(this);
    } while (uVar3 < CONCAT44(extraout_var_01,iVar1));
  }
  return SVar4;
}

Assistant:

SchemaResolution
NodeUnion::resolve(const Node &reader) const 
{

    // If the writer is union, resolution only needs to occur when the selected
    // type of the writer is known, so this function is not very helpful.
    //
    // In this case, this function returns if there is a possible match given
    // any writer type, so just search type by type returning the best match
    // found.
    
    SchemaResolution match = RESOLVE_NO_MATCH;
    for(size_t i=0; i < leaves(); ++i) {
        const NodePtr &node = leafAt(i);
        SchemaResolution thisMatch = node->resolve(reader);
        if(thisMatch == RESOLVE_MATCH) {
            match = thisMatch;
            break;
        }
        if(match == RESOLVE_NO_MATCH) {
            match = thisMatch;
        }
    }
    return match;
}